

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.cpp
# Opt level: O0

bool SetDevice(char *const_id,aint ramtop)

{
  bool bVar1;
  int iVar2;
  CDeviceSlot *pCVar3;
  size_t sVar4;
  char *__format;
  char *bufAppend;
  size_t bufLen;
  char local_848 [4];
  int slotI;
  char buf [2048];
  int slotsCount;
  int pageCount;
  int pageSize;
  char *id;
  CDevice *parent;
  CDevice **dev;
  char *pcStack_18;
  aint ramtop_local;
  char *const_id_local;
  
  id = (char *)0x0;
  if ((const_id == (char *)0x0) ||
     (_pageCount = const_id, dev._4_4_ = ramtop, pcStack_18 = const_id,
     iVar2 = cmphstr((char **)&pageCount,"none",false), iVar2 != 0)) {
    DeviceID = (char *)0x0;
    Device = (CDevice *)0x0;
  }
  else {
    if ((DeviceID == (char *)0x0) || (iVar2 = strcmp(DeviceID,_pageCount), iVar2 != 0)) {
      DeviceID = (char *)0x0;
      parent = (CDevice *)&Devices;
      while (parent->ID != (char *)0x0) {
        id = parent->ID;
        iVar2 = strcmp(*(char **)id,_pageCount);
        if (iVar2 == 0) break;
        parent = (CDevice *)(id + 8);
      }
      if (parent->ID == (char *)0x0) {
        iVar2 = cmphstr((char **)&pageCount,"zxspectrum48",false);
        if (iVar2 == 0) {
          iVar2 = cmphstr((char **)&pageCount,"zxspectrum128",false);
          if (iVar2 == 0) {
            iVar2 = cmphstr((char **)&pageCount,"zxspectrum256",false);
            if (iVar2 == 0) {
              iVar2 = cmphstr((char **)&pageCount,"zxspectrum512",false);
              if (iVar2 == 0) {
                iVar2 = cmphstr((char **)&pageCount,"zxspectrum1024",false);
                if (iVar2 == 0) {
                  iVar2 = cmphstr((char **)&pageCount,"zxspectrum2048",false);
                  if (iVar2 == 0) {
                    iVar2 = cmphstr((char **)&pageCount,"zxspectrum4096",false);
                    if (iVar2 == 0) {
                      iVar2 = cmphstr((char **)&pageCount,"zxspectrum8192",false);
                      if (iVar2 == 0) {
                        iVar2 = cmphstr((char **)&pageCount,"zxspectrumnext",false);
                        if (iVar2 == 0) {
                          iVar2 = cmphstr((char **)&pageCount,"noslot64k",false);
                          if (iVar2 == 0) {
                            iVar2 = cmphstr((char **)&pageCount,"amstradcpc464",false);
                            if (iVar2 == 0) {
                              iVar2 = cmphstr((char **)&pageCount,"amstradcpc6128",false);
                              if (iVar2 == 0) {
                                iVar2 = cmphstr((char **)&pageCount,"amstradcpcplus",false);
                                if (iVar2 == 0) {
                                  bVar1 = SetUserDefinedDevice
                                                    (_pageCount,(CDevice **)parent,(CDevice *)id,
                                                     dev._4_4_);
                                  if (!bVar1) {
                                    return false;
                                  }
                                }
                                else {
                                  DeviceAmstradCPCPLUS((CDevice **)parent,(CDevice *)id,dev._4_4_);
                                }
                              }
                              else {
                                DeviceAmstradCPC6128((CDevice **)parent,(CDevice *)id,dev._4_4_);
                              }
                            }
                            else {
                              DeviceAmstradCPC464((CDevice **)parent,(CDevice *)id,dev._4_4_);
                            }
                          }
                          else {
                            DeviceNoSlot64k((CDevice **)parent,(CDevice *)id,dev._4_4_);
                          }
                        }
                        else {
                          DeviceZxSpectrumNext((CDevice **)parent,(CDevice *)id,dev._4_4_);
                        }
                      }
                      else {
                        DeviceZXSpectrum8192((CDevice **)parent,(CDevice *)id,dev._4_4_);
                      }
                    }
                    else {
                      DeviceZXSpectrum4096((CDevice **)parent,(CDevice *)id,dev._4_4_);
                    }
                  }
                  else {
                    DeviceZXSpectrum2048((CDevice **)parent,(CDevice *)id,dev._4_4_);
                  }
                }
                else {
                  DeviceZXSpectrum1024((CDevice **)parent,(CDevice *)id,dev._4_4_);
                }
              }
              else {
                DeviceZXSpectrum512((CDevice **)parent,(CDevice *)id,dev._4_4_);
              }
            }
            else {
              DeviceZXSpectrum256((CDevice **)parent,(CDevice *)id,dev._4_4_);
            }
          }
          else {
            DeviceZXSpectrum128((CDevice **)parent,(CDevice *)id,dev._4_4_);
          }
        }
        else {
          DeviceZXSpectrum48((CDevice **)parent,(CDevice *)id,dev._4_4_);
        }
      }
      Device = (CDevice *)parent->ID;
      DeviceID = Device->ID;
      CDevice::CheckPage(Device,CHECK_RESET);
    }
    if (((dev._4_4_ != 0) && (Device->ZxRamTop != 0)) && (dev._4_4_ != Device->ZxRamTop)) {
      WarningById(W_DEV_RAMTOP,(char *)0x0,W_PASS3);
    }
    bVar1 = IsSldExportActive();
    if (bVar1) {
      pCVar3 = CDevice::GetCurrentSlot(Device);
      buf._2044_4_ = Device->SlotsCount;
      snprintf(local_848,0x800,"pages.size:%d,pages.count:%d,slots.count:%d",
               (ulong)(uint)pCVar3->Size,(ulong)(uint)Device->PagesCount,(ulong)(uint)buf._2044_4_);
      for (bufLen._4_4_ = 0; bufLen._4_4_ < (int)buf._2044_4_; bufLen._4_4_ = bufLen._4_4_ + 1) {
        sVar4 = strlen(local_848);
        __format = ",%d";
        if (bufLen._4_4_ == 0) {
          __format = ",slots.adr:%d";
        }
        pCVar3 = CDevice::GetSlot(Device,bufLen._4_4_);
        snprintf(local_848 + sVar4,0x800 - sVar4,__format,(ulong)(uint)pCVar3->Address);
      }
      WriteToSldFile(-1,-1,'Z',local_848);
    }
  }
  return true;
}

Assistant:

bool SetDevice(const char *const_id, const aint ramtop) {
	CDevice** dev;
	CDevice* parent = nullptr;
	char* id = const_cast<char*>(const_id);		//TODO cmphstr for both const/nonconst variants?
		// ^ argument is const because of lua bindings

	if (!id || cmphstr(id, "none")) {
		DeviceID = nullptr;
		Device = nullptr;
		return true;
	}

	if (!DeviceID || strcmp(DeviceID, id)) {	// different device than current, change to it
		DeviceID = nullptr;
		dev = &Devices;
		// search for device
		while (*dev) {
			parent = *dev;
			if (!strcmp(parent->ID, id)) break;
			dev = &(parent->Next);
		}
		if (nullptr == (*dev)) {	// device not found
			if (cmphstr(id, "zxspectrum48")) {			// must be lowercase to catch both cases
				DeviceZXSpectrum48(dev, parent, ramtop);
			} else if (cmphstr(id, "zxspectrum128")) {
				DeviceZXSpectrum128(dev, parent, ramtop);
			} else if (cmphstr(id, "zxspectrum256")) {
				DeviceZXSpectrum256(dev, parent, ramtop);
			} else if (cmphstr(id, "zxspectrum512")) {
				DeviceZXSpectrum512(dev, parent, ramtop);
			} else if (cmphstr(id, "zxspectrum1024")) {
				DeviceZXSpectrum1024(dev, parent, ramtop);
			} else if (cmphstr(id, "zxspectrum2048")) {
				DeviceZXSpectrum2048(dev, parent, ramtop);
			} else if (cmphstr(id, "zxspectrum4096")) {
				DeviceZXSpectrum4096(dev, parent, ramtop);
			} else if (cmphstr(id, "zxspectrum8192")) {
				DeviceZXSpectrum8192(dev, parent, ramtop);
			} else if (cmphstr(id, "zxspectrumnext")) {
				DeviceZxSpectrumNext(dev, parent, ramtop);
			} else if (cmphstr(id, "noslot64k")) {
				DeviceNoSlot64k(dev, parent, ramtop);
			} else if (cmphstr(id, "amstradcpc464")) {
				DeviceAmstradCPC464(dev, parent, ramtop);
			} else if (cmphstr(id, "amstradcpc6128")) {
				DeviceAmstradCPC6128(dev, parent, ramtop);
			} else if (cmphstr(id, "amstradcpcplus")) {
				DeviceAmstradCPCPLUS(dev, parent, ramtop);
			} else if (!SetUserDefinedDevice(id, dev, parent, ramtop)) {
				return false;
			}
		}
		// set up the found/new device
		Device = (*dev);
		DeviceID = Device->ID;
		Device->CheckPage(CDevice::CHECK_RESET);
	}
	if (ramtop && Device->ZxRamTop && ramtop != Device->ZxRamTop) {
		WarningById(W_DEV_RAMTOP);
	}
	if (IsSldExportActive()) {
		// SLD tracing data are being exported, export the device data
		int pageSize = Device->GetCurrentSlot()->Size;
		int pageCount = Device->PagesCount;
		int slotsCount = Device->SlotsCount;
		char buf[LINEMAX];
		snprintf(buf, LINEMAX, "pages.size:%d,pages.count:%d,slots.count:%d",
			pageSize, pageCount, slotsCount
		);
		for (int slotI = 0; slotI < slotsCount; ++slotI) {
			size_t bufLen = strlen(buf);
			char* bufAppend = buf + bufLen;
			snprintf(bufAppend, LINEMAX-bufLen,
						(0 == slotI) ? ",slots.adr:%d" : ",%d",
						Device->GetSlot(slotI)->Address);
		}
		// pagesize
		WriteToSldFile(-1,-1,'Z',buf);
	}
	return true;
}